

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glad.c
# Opt level: O0

void load_GL_EXT_texture_object(GLADloadproc load)

{
  GLADloadproc load_local;
  
  if (GLAD_GL_EXT_texture_object != 0) {
    glad_glAreTexturesResidentEXT =
         (PFNGLARETEXTURESRESIDENTEXTPROC)(*load)("glAreTexturesResidentEXT");
    glad_glBindTextureEXT = (PFNGLBINDTEXTUREEXTPROC)(*load)("glBindTextureEXT");
    glad_glDeleteTexturesEXT = (PFNGLDELETETEXTURESEXTPROC)(*load)("glDeleteTexturesEXT");
    glad_glGenTexturesEXT = (PFNGLGENTEXTURESEXTPROC)(*load)("glGenTexturesEXT");
    glad_glIsTextureEXT = (PFNGLISTEXTUREEXTPROC)(*load)("glIsTextureEXT");
    glad_glPrioritizeTexturesEXT =
         (PFNGLPRIORITIZETEXTURESEXTPROC)(*load)("glPrioritizeTexturesEXT");
  }
  return;
}

Assistant:

static void load_GL_EXT_texture_object(GLADloadproc load) {
	if(!GLAD_GL_EXT_texture_object) return;
	glad_glAreTexturesResidentEXT = (PFNGLARETEXTURESRESIDENTEXTPROC)load("glAreTexturesResidentEXT");
	glad_glBindTextureEXT = (PFNGLBINDTEXTUREEXTPROC)load("glBindTextureEXT");
	glad_glDeleteTexturesEXT = (PFNGLDELETETEXTURESEXTPROC)load("glDeleteTexturesEXT");
	glad_glGenTexturesEXT = (PFNGLGENTEXTURESEXTPROC)load("glGenTexturesEXT");
	glad_glIsTextureEXT = (PFNGLISTEXTUREEXTPROC)load("glIsTextureEXT");
	glad_glPrioritizeTexturesEXT = (PFNGLPRIORITIZETEXTURESEXTPROC)load("glPrioritizeTexturesEXT");
}